

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int EncodePalette(VP8LBitWriter *bw,int low_effort,VP8LEncoder *enc,int percent_range,int *percent)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t *puVar3;
  long in_RDX;
  uint32_t encoded_palette_size;
  uint32_t *palette;
  int palette_size;
  uint32_t tmp_palette [256];
  int i;
  int in_stack_fffffffffffffb88;
  uint32_t in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  int local_450;
  uint32_t local_438 [50];
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  VP8LBackwardRefs *in_stack_fffffffffffffc98;
  VP8LHashChain *in_stack_fffffffffffffca0;
  uint32_t *in_stack_fffffffffffffca8;
  VP8LBitWriter *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  WebPPicture *in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  int *in_stack_fffffffffffffd00;
  int local_34;
  
  local_450 = *(int *)(in_RDX + 100);
  puVar3 = (uint32_t *)(in_RDX + 0x68);
  if ((*(int *)(in_RDX + 0x68 + (long)(local_450 + -1) * 4) == 0) && (0x11 < local_450)) {
    local_450 = local_450 + -1;
  }
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
              in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
              in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
              in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88);
  while (local_34 = local_450 + -1, 0 < local_34) {
    uVar1 = VP8LSubPixels(puVar3[local_34],puVar3[local_450 + -2]);
    local_438[local_34] = uVar1;
    local_450 = local_34;
  }
  local_438[0] = *puVar3;
  iVar2 = EncodeImageNoHuffman
                    (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                     in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00);
  return iVar2;
}

Assistant:

static int EncodePalette(VP8LBitWriter* const bw, int low_effort,
                         VP8LEncoder* const enc, int percent_range,
                         int* const percent) {
  int i;
  uint32_t tmp_palette[MAX_PALETTE_SIZE];
  const int palette_size = enc->palette_size_;
  const uint32_t* const palette = enc->palette_;
  // If the last element is 0, do not store it and count on automatic palette
  // 0-filling. This can only happen if there is no pixel packing, hence if
  // there are strictly more than 16 colors (after 0 is removed).
  const uint32_t encoded_palette_size =
      (enc->palette_[palette_size - 1] == 0 && palette_size > 17)
          ? palette_size - 1
          : palette_size;
  VP8LPutBits(bw, TRANSFORM_PRESENT, 1);
  VP8LPutBits(bw, COLOR_INDEXING_TRANSFORM, 2);
  assert(palette_size >= 1 && palette_size <= MAX_PALETTE_SIZE);
  VP8LPutBits(bw, encoded_palette_size - 1, 8);
  for (i = encoded_palette_size - 1; i >= 1; --i) {
    tmp_palette[i] = VP8LSubPixels(palette[i], palette[i - 1]);
  }
  tmp_palette[0] = palette[0];
  return EncodeImageNoHuffman(
      bw, tmp_palette, &enc->hash_chain_, &enc->refs_[0], encoded_palette_size,
      1, /*quality=*/20, low_effort, enc->pic_, percent_range, percent);
}